

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localization_backend.cpp
# Opt level: O1

locale __thiscall
booster::locale::localization_backend_manager::impl::actual_backend::install
          (actual_backend *this,locale *l,locale_category_type category,character_facet_type type)

{
  ulong uVar1;
  long lVar2;
  undefined4 in_register_00000014;
  character_facet_type cVar3;
  bool bVar4;
  
  if (type == 1) {
    uVar1 = 0;
    bVar4 = false;
  }
  else {
    cVar3 = 1;
    uVar1 = 0;
    do {
      cVar3 = cVar3 * 2;
      uVar1 = uVar1 + 1;
      bVar4 = cVar3 == 0;
      if (bVar4) break;
    } while (cVar3 != type);
  }
  if (((!bVar4) && (uVar1 < (ulong)((long)l[5]._M_impl - (long)l[4]._M_impl >> 2))) &&
     (lVar2 = (long)*(int *)(l[4]._M_impl + uVar1 * 4), lVar2 != -1)) {
    (**(code **)(**(long **)(l[1]._M_impl + lVar2 * 0x10) + 0x28))(this);
    return (locale)(_Impl *)this;
  }
  std::locale::locale((locale *)this,(locale *)CONCAT44(in_register_00000014,category));
  return (locale)(_Impl *)this;
}

Assistant:

virtual std::locale install(std::locale const &l,locale_category_type category,character_facet_type type = nochar_facet)
                {
                    int id;
                    unsigned v;
                    for(v=1,id=0;v!=0;v<<=1,id++) {
                        if(category == v)
                            break;
                    }
                    if(v==0)
                        return l;
                    if(unsigned(id) >= index_.size())
                        return l;
                    if(index_[id]==-1) 
                        return l;
                    return backends_[index_[id]]->install(l,category,type);
                }